

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool __thiscall ghc::filesystem::path::has_extension(path *this)

{
  bool bVar1;
  path local_30;
  path *local_10;
  path *this_local;
  
  local_10 = this;
  extension(&local_30,this);
  bVar1 = empty(&local_30);
  ~path(&local_30);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

GHC_INLINE bool path::has_extension() const
{
    return !extension().empty();
}